

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

void __thiscall CMU462::Matrix4x4::operator/=(Matrix4x4 *this,double x)

{
  double *pdVar1;
  undefined4 local_30;
  undefined4 local_2c;
  int j;
  int i;
  double rx;
  Matrix4x4 *A;
  double x_local;
  Matrix4x4 *this_local;
  
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
      pdVar1 = operator()(this,local_2c,local_30);
      *pdVar1 = (1.0 / x) * *pdVar1;
    }
  }
  return;
}

Assistant:

void Matrix4x4::operator/=( double x ) {
    Matrix4x4& A( *this );
    double rx = 1./x;

    for( int i = 0; i < 4; i++ )
    for( int j = 0; j < 4; j++ )
    {
       A( i, j ) *= rx;
    }
  }